

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFunc
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,size_t param_3,char *param_4
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          undefined8 param_7,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *param_8
          ,Index param_9)

{
  Module *wasm;
  Name name;
  Err *pEVar1;
  Function **ppFVar2;
  size_type sVar3;
  bool bVar4;
  Ok local_1b9;
  value_type local_1b8;
  Err local_188;
  Err *local_168;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Function_*> _val_1;
  undefined1 local_d0 [8];
  Result<wasm::Function_*> f;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  ImportNames *import_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  ParseDeclsCtx *this_local;
  optional<wasm::Ok> param_5_local;
  Name name_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = import;
  checkImport((Result<wasm::Ok> *)&err,this,param_9,import);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_1_ = local_70 != (Err *)0x0;
  if ((bool)f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_4_ == 0) {
    name.super_IString.str._M_str = param_4;
    name.super_IString.str._M_len = param_3;
    _val_1.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._32_8_ = param_3;
    addFuncDecl((Result<wasm::Function_*> *)local_d0,this,param_9,name,
                (ImportNames *)
                _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    Result<wasm::Function_*>::Result
              ((Result<wasm::Function_*> *)&err_1,(Result<wasm::Function_*> *)local_d0);
    pEVar1 = Result<wasm::Function_*>::getErr((Result<wasm::Function_*> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._37_3_ = 0;
    f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Function_*>::~Result((Result<wasm::Function_*> *)&err_1);
    if (f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_4_ == 0) {
      wasm = this->wasm;
      ppFVar2 = Result<wasm::Function_*>::operator*((Result<wasm::Function_*> *)local_d0);
      anon_unknown_5::addExports
                ((Result<wasm::Ok> *)&err_2,&this->in,wasm,(Named *)*ppFVar2,exports,Function);
      local_168 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar4 = local_168 != (Err *)0x0;
      if (bVar4) {
        wasm::Err::Err(&local_188,local_168);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
        wasm::Err::~Err(&local_188);
      }
      f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._37_3_ = 0;
      f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_1_ = bVar4;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_4_ == 0) {
        local_1b8.pos = param_9;
        local_1b8.name.super_IString.str._M_len = param_3;
        local_1b8.name.super_IString.str._M_str = param_4;
        sVar3 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                          (&this->funcDefs);
        local_1b8.index = (Index)sVar3;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector(&local_1b8.annotations,param_8);
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
                  (&this->funcDefs,&local_1b8);
        DefPos::~DefPos(&local_1b8);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1b9);
        f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Function_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Function_*,_wasm::Err>._36_4_ = 1;
      }
    }
    Result<wasm::Function_*>::~Result((Result<wasm::Function_*> *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addFunc(Name name,
                                const std::vector<Name>& exports,
                                ImportNames* import,
                                TypeUseT type,
                                std::optional<LocalsT>,
                                std::vector<Annotation>&& annotations,
                                Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto f = addFuncDecl(pos, name, import);
  CHECK_ERR(f);
  CHECK_ERR(addExports(in, wasm, *f, exports, ExternalKind::Function));
  funcDefs.push_back(
    {name, pos, Index(funcDefs.size()), std::move(annotations)});
  return Ok{};
}